

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::LinearQuantizationParams::_InternalSerialize
          (LinearQuantizationParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  bool bVar4;
  LogMessage *pLVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  byte *pbVar11;
  undefined8 *puVar12;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (0 < (this->scale_).current_size_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar1 = (this->scale_).current_size_;
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    uVar9 = iVar1 << 2;
    *target = 10;
    pbVar6 = target + 1;
    uVar8 = uVar9;
    uVar7 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar6;
        *target = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar6 = target + 1;
        bVar4 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar4);
    }
    pbVar11 = target + 2;
    *pbVar6 = (byte)uVar8;
    pvVar2 = (this->scale_).arena_or_elements_;
    sVar10 = (size_t)(int)uVar9;
    if ((long)stream->end_ - (long)pbVar11 < (long)sVar10) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar2,uVar9,pbVar11);
    }
    else {
      memcpy(pbVar11,pvVar2,sVar10);
      target = pbVar11 + sVar10;
    }
  }
  if (0 < (this->bias_).current_size_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar1 = (this->bias_).current_size_;
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_a1,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    uVar9 = iVar1 << 2;
    *target = 0x12;
    pbVar6 = target + 1;
    uVar8 = uVar9;
    uVar7 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar6;
        *target = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar6 = target + 1;
        bVar4 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar4);
    }
    pbVar11 = target + 2;
    *pbVar6 = (byte)uVar8;
    pvVar2 = (this->bias_).arena_or_elements_;
    sVar10 = (size_t)(int)uVar9;
    if ((long)stream->end_ - (long)pbVar11 < (long)sVar10) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar2,uVar9,pbVar11);
    }
    else {
      memcpy(pbVar11,pvVar2,sVar10);
      target = pbVar11 + sVar10;
    }
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    pvVar2 = *(void **)((uVar3 & 0xfffffffffffffffc) + 8);
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar3 & 1) == 0) {
      puVar12 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar12 = (undefined8 *)((uVar3 & 0xfffffffffffffffc) + 8);
    }
    sVar10 = (size_t)(int)puVar12[1];
    if ((long)stream->end_ - (long)target < (long)sVar10) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar2,(int)puVar12[1],target);
    }
    else {
      memcpy(target,pvVar2,sVar10);
      target = target + sVar10;
    }
  }
  return target;
}

Assistant:

uint8_t* LinearQuantizationParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.LinearQuantizationParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float scale = 1;
  if (this->_internal_scale_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_scale(), target);
  }

  // repeated float bias = 2;
  if (this->_internal_bias_size() > 0) {
    target = stream->WriteFixedPacked(2, _internal_bias(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.LinearQuantizationParams)
  return target;
}